

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O0

QWidget * __thiscall QAccessibleWidget::widget(QAccessibleWidget *this)

{
  QWidget *pQVar1;
  QObject *in_RDI;
  
  (**(code **)(*(long *)in_RDI + 0x18))();
  pQVar1 = qobject_cast<QWidget*>(in_RDI);
  return pQVar1;
}

Assistant:

QWidget *QAccessibleWidget::widget() const
{
    return qobject_cast<QWidget*>(object());
}